

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

bool __thiscall
google::
dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::serialize<google::sparsehash_internal::pod_serializer<std::pair<int,int>>,StringIO>
          (dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           *this,StringIO *param_2)

{
  int iVar1;
  bool bVar2;
  ulong in_RAX;
  long lVar3;
  int iVar4;
  int bit;
  long lVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uchar bits;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)this);
  bVar2 = sparsehash_internal::write_bigendian_number<StringIO,unsigned_long>(param_2,0x13578642,4);
  if (((bVar2) &&
      (bVar2 = sparsehash_internal::write_bigendian_number<StringIO,unsigned_long>
                         (param_2,*(unsigned_long *)(this + 0x60),8), bVar2)) &&
     (bVar2 = sparsehash_internal::write_bigendian_number<StringIO,unsigned_long>
                        (param_2,*(unsigned_long *)(this + 0x58),8), bVar2)) {
    uVar7 = *(ulong *)(this + 0x60);
    if (uVar7 == 0) {
      return true;
    }
    lVar9 = 0;
    uVar8 = 0;
    do {
      uStack_38 = uStack_38 & 0xffffffffffffff;
      iVar4 = *(int *)(this + 0x38);
      lVar3 = 0;
      bVar6 = 0;
      do {
        if (lVar3 + uVar8 < uVar7) {
          iVar4 = iVar4 + 1;
          iVar1 = *(int *)(*(long *)(this + 0x78) + lVar9 + lVar3 * 8);
          *(int *)(this + 0x38) = iVar4;
          if (iVar1 + *(int *)(this + 0x44) != 0) {
            bVar6 = bVar6 | (byte)(1 << ((byte)lVar3 & 0x1f));
            uStack_38 = CONCAT17(bVar6,(undefined7)uStack_38);
          }
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 8);
      std::__cxx11::string::append((char *)param_2->s_,(long)&uStack_38 + 7);
      lVar5 = 0;
      lVar3 = lVar9;
      do {
        if ((uStack_38._7_1_ >> ((uint)lVar5 & 0x1f) & 1) != 0) {
          std::__cxx11::string::append((char *)param_2->s_,*(long *)(this + 0x78) + lVar3);
        }
        lVar5 = lVar5 + 1;
        lVar3 = lVar3 + 8;
      } while (lVar5 != 8);
      uVar8 = uVar8 + 8;
      uVar7 = *(ulong *)(this + 0x60);
      lVar9 = lVar9 + 0x40;
    } while (uVar8 < uVar7);
    return true;
  }
  return false;
}

Assistant:

bool serialize(ValueSerializer serializer, OUTPUT* fp) {
    squash_deleted();  // so we don't have to worry about delkey
    if (!sparsehash_internal::write_bigendian_number(fp, MAGIC_NUMBER, 4))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_buckets, 8))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_elements, 8))
      return false;
    // Now write a bitmap of non-empty buckets.
    for (size_type i = 0; i < num_buckets; i += 8) {
      unsigned char bits = 0;
      for (int bit = 0; bit < 8; ++bit) {
        if (i + bit < num_buckets && !test_empty(i + bit)) bits |= (1 << bit);
      }
      if (!sparsehash_internal::write_data(fp, &bits, sizeof(bits)))
        return false;
      for (int bit = 0; bit < 8; ++bit) {
        if (bits & (1 << bit)) {
          if (!serializer(fp, table[i + bit])) return false;
        }
      }
    }
    return true;
  }